

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall
ColorPrimariesBT601_525_SMPTE::ColorPrimariesBT601_525_SMPTE(ColorPrimariesBT601_525_SMPTE *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  ColorPrimaryTransform *in_RDI;
  ColorPrimaryTransform *inToXYZ;
  ColorPrimaries *in_stack_fffffffffffffee0;
  allocator_type *in_stack_fffffffffffffef8;
  allocator_type *__a;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff00;
  vector<float,_std::allocator<float>_> *this_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar1;
  undefined1 in_stack_ffffffffffffff0c [12];
  undefined1 local_89 [49];
  undefined1 *local_58;
  undefined8 local_50;
  
  local_89._17_8_ = 0x3db148773f3378ab;
  local_89._25_8_ = 0x3de53da73c998288;
  local_89._1_8_ = 0x3ebb03193ec97b96;
  local_89._9_8_ = 0x3e5979183e4446fa;
  local_89._33_4_ = 0x3f7558b8;
  local_58 = local_89 + 1;
  local_50 = 9;
  inToXYZ = (ColorPrimaryTransform *)local_89;
  std::allocator<float>::allocator((allocator<float> *)0x250543);
  __l._4_12_ = in_stack_ffffffffffffff0c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff08;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff00,__l,in_stack_fffffffffffffef8);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&in_stack_fffffffffffffee0->toXYZ,(vector<float,_std::allocator<float>_> *)inToXYZ);
  __a = (allocator_type *)0x3d100f773ffd27dd;
  this_00 = (vector<float,_std::allocator<float>_> *)0xbe49b4143d66a22b;
  uVar1 = 0x3f8664d4;
  std::allocator<float>::allocator((allocator<float> *)0x2505bf);
  __l_00._4_12_ = in_stack_ffffffffffffff0c;
  __l_00._M_array._0_4_ = uVar1;
  std::vector<float,_std::allocator<float>_>::vector(this_00,__l_00,__a);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&in_stack_fffffffffffffee0->toXYZ,(vector<float,_std::allocator<float>_> *)inToXYZ);
  ColorPrimaries::ColorPrimaries(in_stack_fffffffffffffee0,inToXYZ,in_RDI);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x250615);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x25062f);
  return;
}

Assistant:

ColorPrimariesBT601_525_SMPTE() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.393521f, +0.365258f, +0.191677f,
            +0.212376f, +0.701060f, +0.086564f,
            +0.018739f, +0.111934f, +0.958385f
        }),
        ColorPrimaryTransform({
            +3.506003f, -1.739791f, -0.544058f,
            -1.069048f, +1.977779f, +0.035171f,
            +0.056307f, -0.196976f, +1.049952f
        })
    ) {}